

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveAlignFill::writeSymData(CDirectiveAlignFill *this,SymbolData *symData)

{
  uint uVar1;
  SymbolData *symData_local;
  CDirectiveAlignFill *this_local;
  
  uVar1 = *(uint *)&(this->super_CAssemblerCommand).field_0x14;
  if ((1 < uVar1) && (uVar1 == 2)) {
    SymbolData::addData(symData,this->virtualAddress,this->value,Data8);
  }
  return;
}

Assistant:

void CDirectiveAlignFill::writeSymData(SymbolData& symData) const
{
	switch (mode)
	{
	case AlignVirtual:	// ?
	case AlignPhysical:	// ?
		break;
	case Fill:
		symData.addData(virtualAddress,value,SymbolData::Data8);
		break;
	}
}